

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuaternion.h
# Opt level: O0

ChVector<double> * __thiscall
chrono::ChQuaternion<double>::RotateBack
          (ChVector<double> *__return_storage_ptr__,ChQuaternion<double> *this,ChVector<double> *A)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double *pdVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  double e2e3;
  double e1e3;
  double e1e2;
  double e0e3;
  double e0e2;
  double e0e1;
  double e3e3;
  double e2e2;
  double e1e1;
  double e0e0;
  ChVector<double> *A_local;
  ChQuaternion<double> *this_local;
  
  dVar6 = this->m_data[0] * this->m_data[0];
  dVar1 = this->m_data[2];
  dVar2 = this->m_data[2];
  dVar3 = this->m_data[3];
  dVar4 = this->m_data[3];
  dVar7 = -this->m_data[0] * this->m_data[1];
  dVar8 = -this->m_data[0] * this->m_data[2];
  dVar9 = -this->m_data[0] * this->m_data[3];
  dVar10 = this->m_data[1] * this->m_data[2];
  dVar11 = this->m_data[1] * this->m_data[3];
  dVar12 = this->m_data[2] * this->m_data[3];
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar6 + this->m_data[1] * this->m_data[1];
  auVar15 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar19,ZEXT816(0xbff0000000000000));
  pdVar13 = ChVector<double>::x(A);
  dVar5 = *pdVar13;
  pdVar13 = ChVector<double>::y(A);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar5;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = auVar15._0_8_;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = (dVar10 - dVar9) * 2.0 * *pdVar13;
  auVar15 = vfmadd213sd_fma(auVar14,auVar20,auVar27);
  pdVar13 = ChVector<double>::z(A);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = auVar15._0_8_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = (dVar11 + dVar8) * 2.0;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *pdVar13;
  auVar15 = vfmadd213sd_fma(auVar15,auVar21,auVar28);
  pdVar13 = ChVector<double>::x(A);
  dVar5 = *pdVar13;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar6 + dVar1 * dVar2;
  auVar14 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar22,ZEXT816(0xbff0000000000000));
  pdVar13 = ChVector<double>::y(A);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar5;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = (dVar10 + dVar9) * 2.0;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = auVar14._0_8_ * *pdVar13;
  auVar14 = vfmadd213sd_fma(auVar16,auVar23,auVar29);
  pdVar13 = ChVector<double>::z(A);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = auVar14._0_8_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = (dVar12 - dVar7) * 2.0;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *pdVar13;
  auVar14 = vfmadd213sd_fma(auVar17,auVar24,auVar30);
  pdVar13 = ChVector<double>::x(A);
  dVar1 = *pdVar13;
  pdVar13 = ChVector<double>::y(A);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar1;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = (dVar11 - dVar8) * 2.0;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = (dVar12 + dVar7) * 2.0 * *pdVar13;
  auVar16 = vfmadd213sd_fma(auVar18,auVar25,auVar31);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar6 + dVar3 * dVar4;
  auVar17 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar26,ZEXT816(0xbff0000000000000));
  pdVar13 = ChVector<double>::z(A);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = auVar16._0_8_;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = auVar17._0_8_;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *pdVar13;
  auVar16 = vfmadd213sd_fma(auVar32,auVar33,auVar34);
  ChVector<double>::ChVector(__return_storage_ptr__,auVar15._0_8_,auVar14._0_8_,auVar16._0_8_);
  return __return_storage_ptr__;
}

Assistant:

inline ChVector<Real> ChQuaternion<Real>::RotateBack(const ChVector<Real>& A) const {
    Real e0e0 = +m_data[0] * m_data[0];
    Real e1e1 = +m_data[1] * m_data[1];
    Real e2e2 = +m_data[2] * m_data[2];
    Real e3e3 = +m_data[3] * m_data[3];
    Real e0e1 = -m_data[0] * m_data[1];
    Real e0e2 = -m_data[0] * m_data[2];
    Real e0e3 = -m_data[0] * m_data[3];
    Real e1e2 = +m_data[1] * m_data[2];
    Real e1e3 = +m_data[1] * m_data[3];
    Real e2e3 = +m_data[2] * m_data[3];
    return ChVector<Real>(((e0e0 + e1e1) * 2 - 1) * A.x() + ((e1e2 - e0e3) * 2) * A.y() + ((e1e3 + e0e2) * 2) * A.z(),
                          ((e1e2 + e0e3) * 2) * A.x() + ((e0e0 + e2e2) * 2 - 1) * A.y() + ((e2e3 - e0e1) * 2) * A.z(),
                          ((e1e3 - e0e2) * 2) * A.x() + ((e2e3 + e0e1) * 2) * A.y() + ((e0e0 + e3e3) * 2 - 1) * A.z());
}